

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageHeader_TokenIsPresent_Test::TestBody
          (CoapTest_CoapMessageHeader_TokenIsPresent_Test *this)

{
  char *pcVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  allocator_type local_a2;
  uchar local_a1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  shared_ptr<ot::commissioner::coap::Message> message;
  Error error;
  ByteArray buffer;
  
  error.mCode = 0x41;
  error._4_1_ = 0xfa;
  __l._M_len = 5;
  __l._M_array = (iterator)&error;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buffer,__l,(allocator_type *)&gtest_ar);
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  Message::Deserialize((Message *)&message,&error,&buffer);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)&gtest_ar,"message","nullptr",&message,(void **)&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x80,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)local_78._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_78._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_78._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"error","ErrorCode::kNone",&error,(ErrorCode *)&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x81,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)local_78._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_78._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Message::GetToken((ByteArray *)&gtest_ar,
                    message.
                    super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  local_a1 = 0xfa;
  __l_00._M_len = 1;
  __l_00._M_array = &local_a1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,__l_00,&local_a2);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&gtest_ar_2,"message->GetToken()","ByteArray{0xfa}",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x83,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&message.
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&error.mMessage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_TokenIsPresent)
{
    ByteArray buffer{0x41, 0x00, 0x00, 0x00, 0xfa};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetToken(), ByteArray{0xfa});
}